

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void ngai_do_oper_elem(Integer type,Integer ndim,Integer *loA,Integer *hiA,Integer *ld,
                      void *data_ptr,void *scalar,Integer op)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  long *in_R8;
  long in_stack_00000010;
  Integer n1dim;
  Integer idx;
  void *temp;
  Integer baseld [7];
  Integer bunit [7];
  Integer bvalue [7];
  Integer j;
  Integer i;
  long local_110;
  long local_f8 [5];
  void *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  void *in_stack_ffffffffffffff40;
  long local_b8 [6];
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  void *in_stack_ffffffffffffff80;
  long local_78 [6];
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  void *ptr;
  long local_38;
  
  local_110 = 1;
  for (local_38 = 1; local_38 < in_RSI; local_38 = local_38 + 1) {
    local_110 = ((*(long *)(in_RCX + local_38 * 8) - *(long *)(in_RDX + local_38 * 8)) + 1) *
                local_110;
  }
  local_78[0] = 0;
  local_78[1] = 0;
  local_b8[0] = 1;
  local_b8[1] = 1;
  local_f8[0] = *in_R8;
  local_f8[1] = *in_R8 * in_R8[1];
  for (local_38 = 2; local_38 < in_RSI; local_38 = local_38 + 1) {
    local_78[local_38] = 0;
    local_b8[local_38] =
         local_b8[local_38 + -1] *
         ((*(long *)(in_RCX + (local_38 + -1) * 8) - *(long *)(in_RDX + (local_38 + -1) * 8)) + 1);
    local_f8[local_38] = local_f8[local_38 + -1] * in_R8[local_38];
  }
  for (local_38 = 0; local_38 < local_110; local_38 = local_38 + 1) {
    for (ptr = (void *)0x1; (long)ptr < in_RSI; ptr = (void *)((long)ptr + 1)) {
      if ((local_38 + 1) % local_b8[(long)ptr] == 0) {
        local_78[(long)ptr] = local_78[(long)ptr] + 1;
      }
      if (*(long *)(in_RCX + (long)ptr * 8) - *(long *)(in_RDX + (long)ptr * 8) <
          local_78[(long)ptr]) {
        local_78[(long)ptr] = 0;
      }
    }
    switch(in_RDI) {
    case 0x3e9:
      break;
    case 0x3ea:
      break;
    case 0x3eb:
      break;
    case 0x3ec:
      break;
    default:
      pnga_error((char *)bunit[2],bunit[1]);
      break;
    case 0x3ee:
      break;
    case 0x3ef:
    }
    if (in_stack_00000010 == 0) {
      do_abs(ptr,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    }
    else if (in_stack_00000010 == 1) {
      do_add_const(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff30);
    }
    else if (in_stack_00000010 == 2) {
      do_recip(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    }
    else {
      pnga_error((char *)bunit[2],bunit[1]);
    }
  }
  return;
}

Assistant:

static
void ngai_do_oper_elem(Integer type, Integer ndim, Integer *loA, Integer *hiA,
                       Integer *ld, void *data_ptr, void *scalar, Integer op)
{
  Integer i, j;    
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseld[MAXDIM];
  void *temp = NULL;
  Integer idx, n1dim;
  /* number of n-element of the first dimension */
  n1dim = 1; for(i=1; i<ndim; i++) n1dim *= (hiA[i] - loA[i] + 1);

  /* calculate the destination indices */
  bvalue[0] = 0; bvalue[1] = 0; bunit[0] = 1; bunit[1] = 1;
  /* baseld[0] = ld[0]
   * baseld[1] = ld[0] * ld[1]
   * baseld[2] = ld[0] * ld[1] * ld[2] ....
   */
  baseld[0] = ld[0]; baseld[1] = baseld[0] *ld[1];
  for(i=2; i<ndim; i++) {
    bvalue[i] = 0;
    bunit[i] = bunit[i-1] * (hiA[i-1] - loA[i-1] + 1);
    baseld[i] = baseld[i-1] * ld[i];
  }

  for(i=0; i<n1dim; i++) {
    idx = 0;
    for(j=1; j<ndim; j++) {
      idx += bvalue[j] * baseld[j-1];
      if(((i+1) % bunit[j]) == 0) bvalue[j]++;
      if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
    }

    switch(type){
      case C_INT: 
        temp=((int*)data_ptr)+idx; 
        break;
      case C_DCPL: 
        temp=((DoubleComplex*)data_ptr)+idx; 
        break;
      case C_SCPL: 
        temp=((SingleComplex*)data_ptr)+idx; 
        break;
      case C_DBL: 
        temp=((double*)data_ptr)+idx; 
        break;
      case C_FLOAT:
        temp=((float*)data_ptr)+idx;
        break;
      case C_LONG:
        temp=((long *)data_ptr)+idx;
        break;
      default: pnga_error("wrong data type.",type);	

    }

    switch(op){
      case OP_ABS:
        do_abs(temp ,hiA[0] -loA[0] +1, type); break;
        break;
      case OP_ADD_CONST:
        do_add_const(temp ,hiA[0] -loA[0] +1, type, scalar); 
        break;
      case OP_RECIP:
        do_recip(temp ,hiA[0] -loA[0] +1, type); break;
        break;
      default: pnga_error("bad operation",op);
    }
  }

}